

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t validate_time_flag(archive *_a,wchar_t flag,char *_fn)

{
  int iVar1;
  wchar_t magic_test;
  char *_fn_local;
  wchar_t flag_local;
  archive *_a_local;
  
  iVar1 = __archive_check_magic(_a,0xcad11c9,1,_fn);
  if (iVar1 == -0x1e) {
    _a_local._4_4_ = L'\xffffffe2';
  }
  else if ((flag & 0xfc00U) == 0) {
    if ((flag & 0x300U) == 0) {
      archive_set_error(_a,0x16,"No time flag");
      _a_local._4_4_ = L'\xffffffe7';
    }
    else if ((flag & 0xecU) == 0) {
      if ((flag & 0x13U) == 0) {
        archive_set_error(_a,0x16,"No comparison flag");
        _a_local._4_4_ = L'\xffffffe7';
      }
      else {
        _a_local._4_4_ = L'\0';
      }
    }
    else {
      archive_set_error(_a,0x16,"Invalid comparison flag");
      _a_local._4_4_ = L'\xffffffe7';
    }
  }
  else {
    archive_set_error(_a,0x16,"Invalid time flag");
    _a_local._4_4_ = L'\xffffffe7';
  }
  return _a_local._4_4_;
}

Assistant:

static int
validate_time_flag(struct archive *_a, int flag, const char *_fn)
{
	archive_check_magic(_a, ARCHIVE_MATCH_MAGIC,
	    ARCHIVE_STATE_NEW, _fn);

	/* Check a type of time. */
	if (flag &
	   ((~(ARCHIVE_MATCH_MTIME | ARCHIVE_MATCH_CTIME)) & 0xff00)) {
		archive_set_error(_a, EINVAL, "Invalid time flag");
		return (ARCHIVE_FAILED);
	}
	if ((flag & (ARCHIVE_MATCH_MTIME | ARCHIVE_MATCH_CTIME)) == 0) {
		archive_set_error(_a, EINVAL, "No time flag");
		return (ARCHIVE_FAILED);
	}

	/* Check a type of comparison. */
	if (flag &
	   ((~(ARCHIVE_MATCH_NEWER | ARCHIVE_MATCH_OLDER
			| ARCHIVE_MATCH_EQUAL)) & 0x00ff)) {
		archive_set_error(_a, EINVAL, "Invalid comparison flag");
		return (ARCHIVE_FAILED);
	}
	if ((flag & (ARCHIVE_MATCH_NEWER | ARCHIVE_MATCH_OLDER
	    | ARCHIVE_MATCH_EQUAL)) == 0) {
		archive_set_error(_a, EINVAL, "No comparison flag");
		return (ARCHIVE_FAILED);
	}

	return (ARCHIVE_OK);
}